

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O0

void string_suite::string_missing_quote(void)

{
  bool bVar1;
  undefined4 local_1b4;
  value local_1b0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined4 local_194;
  value local_190 [2];
  basic_string_view<char,_std::char_traits<char>_> local_188;
  undefined4 local_178;
  value local_174 [5];
  basic_string_view<char,_std::char_traits<char>_> local_160;
  undefined1 local_150 [8];
  chunk_reader reader;
  
  trial::protocol::json::basic_chunk_reader<char>::basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"\"");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x19,"void string_suite::string_missing_quote()",(bool)(~bVar1 & 1));
  local_174[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_178 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1a,"void string_suite::string_missing_quote()",local_174,&local_178);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"\"a");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)local_150,&local_188);
  boost::detail::test_impl
            ("!reader.next(\"\\\"a\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1b,"void string_suite::string_missing_quote()",(bool)(~bVar1 & 1));
  local_190[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_194 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1c,"void string_suite::string_missing_quote()",local_190,&local_194);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1a8,"\"a\"");
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::finish
                    ((basic_chunk_reader<char> *)local_150,&local_1a8);
  boost::detail::test_impl
            ("reader.finish(\"\\\"a\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1d,"void string_suite::string_missing_quote()",bVar1);
  local_1b0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_150);
  local_1b4 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1e,"void string_suite::string_missing_quote()",local_1b0,&local_1b4);
  trial::protocol::json::basic_chunk_reader<char>::~basic_chunk_reader
            ((basic_chunk_reader<char> *)local_150);
  return;
}

Assistant:

void string_missing_quote()
{
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("\""));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next("\"a"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(reader.finish("\"a\""));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
}